

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

OPJ_BOOL opj_dwt_encode_procedure
                   (opj_thread_pool_t *tp,opj_tcd_tilecomp_t *tilec,
                   opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
                   opj_encode_and_deinterleave_h_one_row_fnptr_type
                   p_encode_and_deinterleave_h_one_row)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  OPJ_INT32 *pOVar5;
  void *ptr;
  undefined8 *puVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  opj_tcd_resolution_t *poVar12;
  OPJ_UINT32 OVar13;
  opj_tcd_resolution_t *poVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  opj_tcd_resolution_t *poVar21;
  size_t size;
  uint uVar22;
  OPJ_UINT32 OVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  bool bVar27;
  
  uVar1 = opj_thread_pool_get_thread_count(tp);
  poVar14 = tilec->resolutions;
  uVar25 = 0;
  iVar15 = tilec->numresolutions - 1;
  if (iVar15 != 0) {
    pOVar5 = &poVar14[1].y1;
    uVar25 = 0;
    iVar8 = iVar15;
    do {
      uVar20 = pOVar5[-1] - ((opj_tcd_resolution_t *)(pOVar5 + -3))->x0;
      if (uVar20 < uVar25) {
        uVar20 = uVar25;
      }
      uVar25 = *pOVar5 - pOVar5[-2];
      if ((uint)(*pOVar5 - pOVar5[-2]) < uVar20) {
        uVar25 = uVar20;
      }
      pOVar5 = pOVar5 + 0x30;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  pOVar5 = tilec->data;
  OVar23 = tilec->x1 - tilec->x0;
  size = (ulong)uVar25 << 5;
  ptr = opj_aligned_32_malloc(size);
  if (ptr != (void *)0x0 || uVar25 == 0) {
    poVar21 = poVar14 + iVar15;
    poVar14 = poVar14 + (long)iVar15 + -1;
    do {
      bVar27 = iVar15 == 0;
      iVar15 = iVar15 + -1;
      if (bVar27) {
        opj_aligned_free(ptr);
        return 1;
      }
      uVar25 = poVar21->x0;
      uVar20 = poVar21->y0;
      uVar26 = poVar21->x1 - uVar25;
      uVar11 = poVar21->y1;
      iVar8 = poVar14->x1 - poVar21[-1].x0;
      OVar13 = uVar11 - uVar20;
      uVar22 = uVar20 & 1;
      poVar12 = poVar14;
      if (((int)uVar1 < 2) || (uVar26 < 0x10)) {
        uVar16 = 0;
        if (7 < uVar26) {
          uVar10 = 0;
          do {
            uVar16 = uVar10 + 8;
            (*p_encode_and_deinterleave_v)(pOVar5 + uVar10,ptr,OVar13,uVar22 ^ 1,OVar23,8);
            uVar18 = uVar10 + 0xf;
            uVar10 = uVar16;
          } while (uVar18 < uVar26);
        }
        if (uVar16 <= uVar26 && uVar26 - uVar16 != 0) {
          (*p_encode_and_deinterleave_v)
                    (pOVar5 + uVar16,ptr,OVar13,uVar22 ^ 1,OVar23,uVar26 - uVar16);
        }
LAB_0010a665:
        uVar25 = uVar25 & 1;
        if (((int)uVar1 < 2) || (OVar13 < 2)) {
          if (uVar11 != uVar20) {
            uVar17 = (ulong)OVar13;
            uVar19 = 0;
            do {
              (*p_encode_and_deinterleave_h_one_row)(pOVar5 + uVar19,ptr,uVar26,uVar25 ^ 1);
              uVar19 = (ulong)((int)uVar19 + OVar23);
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
        }
        else {
          uVar20 = uVar1;
          if (OVar13 < uVar1) {
            uVar20 = OVar13;
          }
          iVar9 = 0;
          bVar27 = true;
          uVar11 = 1;
          do {
            puVar6 = (undefined8 *)opj_malloc(0x38);
            if (puVar6 == (undefined8 *)0x0) {
              opj_thread_pool_wait_completion(tp,0);
LAB_0010a7fd:
              opj_aligned_free(ptr);
              goto LAB_0010a80a;
            }
            pvVar7 = opj_aligned_32_malloc(size);
            *puVar6 = pvVar7;
            if (pvVar7 == (void *)0x0) {
              opj_thread_pool_wait_completion(tp,0);
              opj_free(puVar6);
              goto LAB_0010a7fd;
            }
            *(uint *)(puVar6 + 1) = uVar26 - iVar8;
            *(int *)((long)puVar6 + 0xc) = iVar8;
            *(uint *)(puVar6 + 2) = uVar25;
            *(uint *)(puVar6 + 3) = uVar26;
            *(OPJ_UINT32 *)((long)puVar6 + 0x1c) = OVar23;
            puVar6[4] = pOVar5;
            *(uint *)(puVar6 + 5) = iVar9 * (OVar13 / uVar20);
            iVar9 = iVar9 + 1;
            OVar4 = iVar9 * (OVar13 / uVar20);
            if (uVar20 == uVar11) {
              OVar4 = OVar13;
            }
            *(OPJ_UINT32 *)((long)puVar6 + 0x2c) = OVar4;
            puVar6[6] = p_encode_and_deinterleave_h_one_row;
            opj_thread_pool_submit_job(tp,opj_dwt_encode_h_func,puVar6);
            bVar27 = uVar11 < uVar20;
            iVar24 = (-(uint)(uVar20 == 0) - uVar20) + uVar11;
            uVar11 = uVar11 + 1;
          } while (iVar24 != 0);
          opj_thread_pool_wait_completion(tp,0);
LAB_0010a80a:
          if (bVar27) {
            bVar27 = false;
            poVar14 = poVar21;
            goto LAB_0010a838;
          }
        }
        poVar12 = poVar14 + -1;
        bVar27 = true;
      }
      else {
        iVar9 = poVar14->y1 - poVar14->y0;
        uVar16 = uVar1;
        if (uVar26 < uVar1) {
          uVar16 = uVar26;
        }
        iVar24 = 0;
        uVar18 = uVar26 / uVar16 & 0xfffffff8;
        bVar27 = true;
        uVar10 = 1;
        do {
          puVar6 = (undefined8 *)opj_malloc(0x38);
          if (puVar6 == (undefined8 *)0x0) {
            opj_thread_pool_wait_completion(tp,0);
LAB_0010a625:
            opj_aligned_free(ptr);
            goto LAB_0010a632;
          }
          pvVar7 = opj_aligned_32_malloc(size);
          *puVar6 = pvVar7;
          if (pvVar7 == (void *)0x0) {
            opj_thread_pool_wait_completion(tp,0);
            opj_free(puVar6);
            goto LAB_0010a625;
          }
          *(OPJ_UINT32 *)(puVar6 + 1) = OVar13 - iVar9;
          *(int *)((long)puVar6 + 0xc) = iVar9;
          *(uint *)(puVar6 + 2) = uVar22;
          *(OPJ_UINT32 *)(puVar6 + 3) = OVar13;
          *(OPJ_UINT32 *)((long)puVar6 + 0x1c) = OVar23;
          puVar6[4] = pOVar5;
          *(uint *)(puVar6 + 5) = iVar24 * uVar18;
          iVar24 = iVar24 + 1;
          uVar2 = iVar24 * uVar18;
          if (uVar16 == uVar10) {
            uVar2 = uVar26;
          }
          *(uint *)((long)puVar6 + 0x2c) = uVar2;
          puVar6[6] = p_encode_and_deinterleave_v;
          opj_thread_pool_submit_job(tp,opj_dwt_encode_v_func,puVar6);
          bVar27 = uVar10 < uVar16;
          iVar3 = (-(uint)(uVar16 == 0) - uVar16) + uVar10;
          uVar10 = uVar10 + 1;
        } while (iVar3 != 0);
        opj_thread_pool_wait_completion(tp,0);
LAB_0010a632:
        if (!bVar27) goto LAB_0010a665;
        bVar27 = false;
        poVar14 = poVar21;
      }
LAB_0010a838:
      poVar21 = poVar14;
      poVar14 = poVar12;
    } while (bVar27);
  }
  return 0;
}

Assistant:

static INLINE OPJ_BOOL opj_dwt_encode_procedure(opj_thread_pool_t* tp,
        opj_tcd_tilecomp_t * tilec,
        opj_encode_and_deinterleave_v_fnptr_type p_encode_and_deinterleave_v,
        opj_encode_and_deinterleave_h_one_row_fnptr_type
        p_encode_and_deinterleave_h_one_row)
{
    OPJ_INT32 i;
    OPJ_INT32 *bj = 00;
    OPJ_UINT32 w;
    OPJ_INT32 l;

    OPJ_SIZE_T l_data_size;

    opj_tcd_resolution_t * l_cur_res = 0;
    opj_tcd_resolution_t * l_last_res = 0;
    const int num_threads = opj_thread_pool_get_thread_count(tp);
    OPJ_INT32 * OPJ_RESTRICT tiledp = tilec->data;

    w = (OPJ_UINT32)(tilec->x1 - tilec->x0);
    l = (OPJ_INT32)tilec->numresolutions - 1;

    l_cur_res = tilec->resolutions + l;
    l_last_res = l_cur_res - 1;

    l_data_size = opj_dwt_max_resolution(tilec->resolutions, tilec->numresolutions);
    /* overflow check */
    if (l_data_size > (SIZE_MAX / (NB_ELTS_V8 * sizeof(OPJ_INT32)))) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    l_data_size *= NB_ELTS_V8 * sizeof(OPJ_INT32);
    bj = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
    /* l_data_size is equal to 0 when numresolutions == 1 but bj is not used */
    /* in that case, so do not error out */
    if (l_data_size != 0 && ! bj) {
        return OPJ_FALSE;
    }
    i = l;

    while (i--) {
        OPJ_UINT32 j;
        OPJ_UINT32 rw;           /* width of the resolution level computed   */
        OPJ_UINT32 rh;           /* height of the resolution level computed  */
        OPJ_UINT32
        rw1;      /* width of the resolution level once lower than computed one                                       */
        OPJ_UINT32
        rh1;      /* height of the resolution level once lower than computed one                                      */
        OPJ_INT32 cas_col;  /* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
        OPJ_INT32 cas_row;  /* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
        OPJ_INT32 dn, sn;

        rw  = (OPJ_UINT32)(l_cur_res->x1 - l_cur_res->x0);
        rh  = (OPJ_UINT32)(l_cur_res->y1 - l_cur_res->y0);
        rw1 = (OPJ_UINT32)(l_last_res->x1 - l_last_res->x0);
        rh1 = (OPJ_UINT32)(l_last_res->y1 - l_last_res->y0);

        cas_row = l_cur_res->x0 & 1;
        cas_col = l_cur_res->y0 & 1;

        sn = (OPJ_INT32)rh1;
        dn = (OPJ_INT32)(rh - rh1);

        /* Perform vertical pass */
        if (num_threads <= 1 || rw < 2 * NB_ELTS_V8) {
            for (j = 0; j + NB_ELTS_V8 - 1 < rw; j += NB_ELTS_V8) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            NB_ELTS_V8);
            }
            if (j < rw) {
                p_encode_and_deinterleave_v(tiledp + j,
                                            bj,
                                            rh,
                                            cas_col == 0,
                                            w,
                                            rw - j);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rw < num_jobs) {
                num_jobs = rw;
            }
            step_j = ((rw / num_jobs) / NB_ELTS_V8) * NB_ELTS_V8;

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_v_job_t* job;

                job = (opj_dwt_encode_v_job_t*) opj_malloc(sizeof(opj_dwt_encode_v_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->v.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->v.dn = dn;
                job->v.sn = sn;
                job->v.cas = cas_col;
                job->rh = rh;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1 == num_jobs) ? rw : (j + 1) * step_j;
                job->p_encode_and_deinterleave_v = p_encode_and_deinterleave_v;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_v_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        sn = (OPJ_INT32)rw1;
        dn = (OPJ_INT32)(rw - rw1);

        /* Perform horizontal pass */
        if (num_threads <= 1 || rh <= 1) {
            for (j = 0; j < rh; j++) {
                OPJ_INT32* OPJ_RESTRICT aj = tiledp + j * w;
                (*p_encode_and_deinterleave_h_one_row)(aj, bj, rw,
                                                       cas_row == 0 ? OPJ_TRUE : OPJ_FALSE);
            }
        }  else {
            OPJ_UINT32 num_jobs = (OPJ_UINT32)num_threads;
            OPJ_UINT32 step_j;

            if (rh < num_jobs) {
                num_jobs = rh;
            }
            step_j = (rh / num_jobs);

            for (j = 0; j < num_jobs; j++) {
                opj_dwt_encode_h_job_t* job;

                job = (opj_dwt_encode_h_job_t*) opj_malloc(sizeof(opj_dwt_encode_h_job_t));
                if (!job) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.mem = (OPJ_INT32*)opj_aligned_32_malloc(l_data_size);
                if (!job->h.mem) {
                    opj_thread_pool_wait_completion(tp, 0);
                    opj_free(job);
                    opj_aligned_free(bj);
                    return OPJ_FALSE;
                }
                job->h.dn = dn;
                job->h.sn = sn;
                job->h.cas = cas_row;
                job->rw = rw;
                job->w = w;
                job->tiledp = tiledp;
                job->min_j = j * step_j;
                job->max_j = (j + 1U) * step_j; /* this can overflow */
                if (j == (num_jobs - 1U)) {  /* this will take care of the overflow */
                    job->max_j = rh;
                }
                job->p_function = p_encode_and_deinterleave_h_one_row;
                opj_thread_pool_submit_job(tp, opj_dwt_encode_h_func, job);
            }
            opj_thread_pool_wait_completion(tp, 0);
        }

        l_cur_res = l_last_res;

        --l_last_res;
    }

    opj_aligned_free(bj);
    return OPJ_TRUE;
}